

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t array_list_insert(int bucket_idx,ion_fpos_t bucket_loc,array_list_t *array_list)

{
  int iVar1;
  long lVar2;
  ion_fpos_t *piVar3;
  long lVar4;
  size_t __n;
  undefined8 uStack_50;
  undefined1 auStack_48 [8];
  ion_fpos_t local_40;
  int local_34;
  
  iVar1 = array_list->current_size;
  if (bucket_idx < iVar1) {
    piVar3 = array_list->data;
  }
  else {
    local_34 = iVar1 * 2;
    array_list->current_size = local_34;
    __n = (long)iVar1 << 3;
    lVar2 = -((long)iVar1 * 8 + 0xfU & 0xfffffffffffffff0);
    piVar3 = array_list->data;
    local_40 = bucket_loc;
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10b69c;
    memcpy(auStack_48 + lVar2,piVar3,__n);
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10b6a4;
    free(piVar3);
    lVar4 = (long)local_34;
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10b6b1;
    piVar3 = (ion_fpos_t *)malloc(lVar4 << 3);
    array_list->data = piVar3;
    iVar1 = array_list->current_size;
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10b6cb;
    memset(piVar3,0,(long)iVar1 << 3);
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10b6d9;
    memcpy(piVar3,auStack_48 + lVar2,__n);
    bucket_loc = local_40;
    if (piVar3 == (ion_fpos_t *)0x0) {
      return '\x06';
    }
  }
  piVar3[bucket_idx] = bucket_loc;
  return '\0';
}

Assistant:

ion_err_t
array_list_insert(
	int				bucket_idx,
	ion_fpos_t		bucket_loc,
	array_list_t	*array_list
) {
	/* case we need to expand array */
	if (bucket_idx >= array_list->current_size) {
		int old_size = array_list->current_size;

		array_list->current_size = array_list->current_size * 2;

		ion_byte_t *bucket_map_cache = alloca(old_size * sizeof(ion_fpos_t));

		memcpy(bucket_map_cache, array_list->data, old_size * sizeof(ion_fpos_t));
		free(array_list->data);
		array_list->data	= NULL;
		array_list->data	= malloc(2 * old_size * sizeof(ion_fpos_t));
		memset(array_list->data, 0, array_list->current_size * sizeof(ion_fpos_t));
		memcpy(array_list->data, bucket_map_cache, old_size * sizeof(ion_fpos_t));

		if (NULL == array_list->data) {
			free(array_list->data);
			return err_out_of_memory;
		}
	}

	array_list->data[bucket_idx] = bucket_loc;

	return err_ok;
}